

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

HeaderStructureRecordHeader * lrit::getHeader<lrit::HeaderStructureRecordHeader>(Buffer *b,int pos)

{
  size_t in_RCX;
  HeaderReader<lrit::HeaderStructureRecordHeader> *in_RDI;
  HeaderReader<lrit::HeaderStructureRecordHeader> r;
  HeaderStructureRecordHeader *h;
  Buffer *in_stack_ffffffffffffff78;
  HeaderReader<lrit::HeaderStructureRecordHeader> *this;
  HeaderReader<lrit::HeaderStructureRecordHeader> local_50;
  
  this = in_RDI;
  HeaderReader<lrit::HeaderStructureRecordHeader>::HeaderReader(in_RDI,in_stack_ffffffffffffff78,0);
  HeaderReader<lrit::HeaderStructureRecordHeader>::getHeader(this);
  HeaderReader<lrit::HeaderStructureRecordHeader>::read
            (&local_50,(int)this + 8,(void *)(long)(int)(*(ushort *)((long)&this->b_ + 2) - 3),
             in_RCX);
  HeaderReader<lrit::HeaderStructureRecordHeader>::~HeaderReader
            ((HeaderReader<lrit::HeaderStructureRecordHeader> *)0x172201);
  return (HeaderStructureRecordHeader *)in_RDI;
}

Assistant:

HeaderStructureRecordHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<HeaderStructureRecordHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.headerStructure, h.headerLength - 3);
  return h;
}